

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall
pugi::impl::anon_unknown_0::namespace_uri_predicate::operator()
          (namespace_uri_predicate *this,xml_attribute a)

{
  bool bVar1;
  char_t *string;
  bool local_32;
  bool local_31;
  char_t *name;
  namespace_uri_predicate *this_local;
  xml_attribute a_local;
  
  this_local = (namespace_uri_predicate *)a._attr;
  string = xml_attribute::name((xml_attribute *)&this_local);
  bVar1 = starts_with(string,"xmlns");
  if (bVar1) {
    if (this->prefix == (char_t *)0x0) {
      local_32 = string[5] == '\0';
    }
    else {
      local_31 = false;
      if (string[5] == ':') {
        local_31 = strequalrange(string + 6,this->prefix,this->prefix_length);
      }
      local_32 = local_31;
    }
    a_local._attr._7_1_ = local_32;
  }
  else {
    a_local._attr._7_1_ = false;
  }
  return a_local._attr._7_1_;
}

Assistant:

bool operator()(xml_attribute a) const
		{
			const char_t* name = a.name();

			if (!starts_with(name, PUGIXML_TEXT("xmlns"))) return false;

			return prefix ? name[5] == ':' && strequalrange(name + 6, prefix, prefix_length) : name[5] == 0;
		}